

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCAnalyzerSettings.cpp
# Opt level: O0

void __thiscall SDMMCAnalyzerSettings::UpdateInterfacesFromSettings(SDMMCAnalyzerSettings *this)

{
  element_type *peVar1;
  SDMMCAnalyzerSettings *this_local;
  
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->
                     (&this->mCommandChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface0)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface1)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface2)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface3)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface4)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface5)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface6)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface7)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mProtocolInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mProtocol);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mBusWidthInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBusWidth);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mSampleEdgeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mSampleEdge);
  return;
}

Assistant:

void SDMMCAnalyzerSettings::UpdateInterfacesFromSettings()
{
	mClockChannelInterface->SetChannel(mClockChannel);
	mCommandChannelInterface->SetChannel(mCommandChannel);
	mDataChannelInterface0->SetChannel(mDataChannel0);
	mDataChannelInterface1->SetChannel(mDataChannel1);
	mDataChannelInterface2->SetChannel(mDataChannel2);
	mDataChannelInterface3->SetChannel(mDataChannel3);
	mDataChannelInterface4->SetChannel(mDataChannel4);
	mDataChannelInterface5->SetChannel(mDataChannel5);
	mDataChannelInterface6->SetChannel(mDataChannel6);
	mDataChannelInterface7->SetChannel(mDataChannel7);
	mProtocolInterface->SetNumber(mProtocol);
	mBusWidthInterface->SetNumber(mBusWidth);
	mSampleEdgeInterface->SetNumber(mSampleEdge);
}